

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.cpp
# Opt level: O0

void __thiscall base_blob<160U>::SetHexDeprecated(base_blob<160U> *this,string_view str)

{
  long lVar1;
  string_view prefix;
  string_view pattern;
  string_view str_00;
  string_view str_01;
  char cVar2;
  byte bVar3;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  const_iterator pvVar4;
  const_iterator pvVar5;
  byte *pbVar6;
  byte *pbVar7;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uchar *pend;
  uchar *p1;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  size_t digits;
  string_view trimmed;
  undefined7 in_stack_ffffffffffffff38;
  char in_stack_ffffffffffffff3f;
  char *in_stack_ffffffffffffff50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  long lVar8;
  char *in_stack_ffffffffffffff88;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)
            std::array<unsigned_char,_20UL>::begin
                      ((array<unsigned_char,_20UL> *)
                       CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::array<unsigned_char,_20UL>::end
            ((array<unsigned_char,_20UL> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::fill<unsigned_char*,int>
            ((uchar *)this_00,in_RDI,
             (int *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  str_01._M_str = in_stack_ffffffffffffff88;
  str_01._M_len = in_stack_ffffffffffffff80;
  pattern._M_str = in_stack_ffffffffffffff78;
  pattern._M_len = in_stack_ffffffffffffff70;
  util::TrimStringView(str_01,pattern);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  str_00._M_str = in_stack_ffffffffffffff78;
  str_00._M_len = in_stack_ffffffffffffff70;
  prefix._M_len._7_1_ = in_stack_ffffffffffffff67;
  prefix._M_len._0_7_ = in_stack_ffffffffffffff60;
  prefix._M_str = in_stack_ffffffffffffff68;
  util::RemovePrefixView(str_00,prefix);
  lVar8 = 0;
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  while ((pvVar4 != pvVar5 && (cVar2 = HexDigit(in_stack_ffffffffffffff3f), cVar2 != -1))) {
    lVar8 = lVar8 + 1;
    pvVar4 = pvVar4 + 1;
  }
  pbVar6 = std::array<unsigned_char,_20UL>::data
                     ((array<unsigned_char,_20UL> *)
                      CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  pbVar7 = pbVar6 + 0x14;
  while (cVar2 = lVar8 != 0 && pbVar6 < pbVar7, lVar8 != 0 && pbVar6 < pbVar7) {
    lVar8 = lVar8 + -1;
    std::basic_string_view<char,_std::char_traits<char>_>::operator[](this_00,(size_type)in_RDI);
    bVar3 = HexDigit(cVar2);
    *pbVar6 = bVar3;
    if (lVar8 != 0) {
      lVar8 = lVar8 + -1;
      std::basic_string_view<char,_std::char_traits<char>_>::operator[](this_00,(size_type)in_RDI);
      cVar2 = HexDigit(cVar2);
      *pbVar6 = *pbVar6 | cVar2 << 4;
      pbVar6 = pbVar6 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void base_blob<BITS>::SetHexDeprecated(const std::string_view str)
{
    std::fill(m_data.begin(), m_data.end(), 0);

    const auto trimmed = util::RemovePrefixView(util::TrimStringView(str), "0x");

    // Note: if we are passed a greater number of digits than would fit as bytes
    // in m_data, we will be discarding the leftmost ones.
    // str="12bc" in a WIDTH=1 m_data => m_data[] == "\0xbc", not "0x12".
    size_t digits = 0;
    for (const char c : trimmed) {
        if (::HexDigit(c) == -1) break;
        ++digits;
    }
    unsigned char* p1 = m_data.data();
    unsigned char* pend = p1 + WIDTH;
    while (digits > 0 && p1 < pend) {
        *p1 = ::HexDigit(trimmed[--digits]);
        if (digits > 0) {
            *p1 |= ((unsigned char)::HexDigit(trimmed[--digits]) << 4);
            p1++;
        }
    }
}